

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

AggregateFunction * duckdb::GetApproxQuantileDecimalList(void)

{
  long lVar1;
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b9;
  LogicalType local_b8;
  LogicalType local_a0;
  LogicalType local_88;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_70;
  LogicalType local_58 [2];
  
  LogicalType::LogicalType(local_58,DECIMAL);
  LogicalType::LogicalType(&local_88,FLOAT);
  LogicalType::LIST(local_58 + 1,&local_88);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_70,__l,&local_b9);
  LogicalType::LogicalType(&local_b8,DECIMAL);
  LogicalType::LIST(&local_a0,&local_b8);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_70,&local_a0,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindApproxQuantileDecimalList,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_a0);
  LogicalType::~LogicalType(&local_b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_70);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_88);
  in_RDI->serialize = ApproximateQuantileBindData::Serialize;
  in_RDI->deserialize = ApproxQuantileDecimalDeserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetApproxQuantileDecimalList() {
	// stub function - the actual function is set during bind or deserialize
	AggregateFunction fun({LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::FLOAT)},
	                      LogicalType::LIST(LogicalTypeId::DECIMAL), nullptr, nullptr, nullptr, nullptr, nullptr,
	                      nullptr, BindApproxQuantileDecimalList);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproxQuantileDecimalDeserialize;
	return fun;
}